

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psnr.c
# Opt level: O1

uint64_t aom_get_y_var(YV12_BUFFER_CONFIG *a,int hstart,int width,int vstart,int height)

{
  int iVar1;
  uint64_t uVar2;
  
  iVar1 = (a->field_4).field_0.y_stride;
  uVar2 = (*aom_var_2d_u8)((a->field_5).buffers[0] + (long)hstart + (long)(vstart * iVar1),iVar1,
                           width,height);
  return uVar2 / (ulong)(long)(height * width);
}

Assistant:

uint64_t aom_get_y_var(const YV12_BUFFER_CONFIG *a, int hstart, int width,
                       int vstart, int height) {
  return aom_var_2d_u8(a->y_buffer + vstart * a->y_stride + hstart, a->y_stride,
                       width, height) /
         (width * height);
}